

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

int main(void)

{
  tuple<LLexer_*,_std::default_delete<LLexer>_> this;
  string code;
  LParser parser;
  __uniq_ptr_impl<LLexer,_std::default_delete<LLexer>_> local_b0;
  long *local_a8;
  long local_a0;
  long local_98 [2];
  string local_88;
  LParser local_68;
  
  local_a8 = local_98;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_a8,
             "if b == (a + c)(b 1 2) then\n   if d == e then       d = 1\n   end\nelse\n   a = 23\nend\nbreak\n"
             ,"");
  this.super__Tuple_impl<0UL,_LLexer_*,_std::default_delete<LLexer>_>.
  super__Head_base<0UL,_LLexer_*,_false>._M_head_impl =
       (_Tuple_impl<0UL,_LLexer_*,_std::default_delete<LLexer>_>)operator_new(0x38);
  local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
  std::__cxx11::string::_M_construct<char*>((string *)&local_88,local_a8,local_a0 + (long)local_a8);
  LStringLexer::LStringLexer
            ((LStringLexer *)
             this.super__Tuple_impl<0UL,_LLexer_*,_std::default_delete<LLexer>_>.
             super__Head_base<0UL,_LLexer_*,_false>._M_head_impl,&local_88);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88._M_dataplus._M_p != &local_88.field_2) {
    operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
  }
  local_b0._M_t.super__Tuple_impl<0UL,_LLexer_*,_std::default_delete<LLexer>_>.
  super__Head_base<0UL,_LLexer_*,_false>._M_head_impl =
       (tuple<LLexer_*,_std::default_delete<LLexer>_>)
       (tuple<LLexer_*,_std::default_delete<LLexer>_>)
       this.super__Tuple_impl<0UL,_LLexer_*,_std::default_delete<LLexer>_>.
       super__Head_base<0UL,_LLexer_*,_false>._M_head_impl;
  LParser::LParser(&local_68,(unique_ptr<LLexer,_std::default_delete<LLexer>_> *)&local_b0);
  if ((_Tuple_impl<0UL,_LLexer_*,_std::default_delete<LLexer>_>)
      local_b0._M_t.super__Tuple_impl<0UL,_LLexer_*,_std::default_delete<LLexer>_>.
      super__Head_base<0UL,_LLexer_*,_false>._M_head_impl != (LLexer *)0x0) {
    (**(code **)(*(long *)local_b0._M_t.
                          super__Tuple_impl<0UL,_LLexer_*,_std::default_delete<LLexer>_>.
                          super__Head_base<0UL,_LLexer_*,_false>._M_head_impl + 8))();
  }
  local_b0._M_t.super__Tuple_impl<0UL,_LLexer_*,_std::default_delete<LLexer>_>.
  super__Head_base<0UL,_LLexer_*,_false>._M_head_impl =
       (tuple<LLexer_*,_std::default_delete<LLexer>_>)
       (_Tuple_impl<0UL,_LLexer_*,_std::default_delete<LLexer>_>)0x0;
  LParser::parse(&local_68);
  std::vector<std::shared_ptr<LNode>,_std::allocator<std::shared_ptr<LNode>_>_>::~vector
            (&local_68.node_stack);
  if (local_68.state_stack.super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_68.state_stack.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_68.state_stack.super__Vector_base<int,_std::allocator<int>_>._M_impl
                          .super__Vector_impl_data._M_end_of_storage -
                    (long)local_68.state_stack.super__Vector_base<int,_std::allocator<int>_>._M_impl
                          .super__Vector_impl_data._M_start);
  }
  if (local_68.peek.super___shared_ptr<LToken,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_68.peek.super___shared_ptr<LToken,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  if (local_68.lexer._M_t.super___uniq_ptr_impl<LLexer,_std::default_delete<LLexer>_>._M_t.
      super__Tuple_impl<0UL,_LLexer_*,_std::default_delete<LLexer>_>.
      super__Head_base<0UL,_LLexer_*,_false>._M_head_impl !=
      (__uniq_ptr_impl<LLexer,_std::default_delete<LLexer>_>)0x0) {
    (*(*(_func_int ***)
        local_68.lexer._M_t.super___uniq_ptr_impl<LLexer,_std::default_delete<LLexer>_>._M_t.
        super__Tuple_impl<0UL,_LLexer_*,_std::default_delete<LLexer>_>.
        super__Head_base<0UL,_LLexer_*,_false>._M_head_impl)[1])();
  }
  if (local_a8 != local_98) {
    operator_delete(local_a8,local_98[0] + 1);
  }
  return 0;
}

Assistant:

int main() {
    std::string code =
            "if b == (a + c)(b 1 2) then\n"
            "   if d == e then"
            "       d = 1\n"
            "   end\n"
            "else\n"
            "   a = 23\n"
            "end\n"
            "break\n";
    auto parser = LParser(std::make_unique<LStringLexer>(code));
    parser.parse();
    return 0;
}